

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O2

void __thiscall
Assimp::STEP::DB::DB(DB *this,shared_ptr<Assimp::StreamReader<false,_false>_> *reader)

{
  _Rb_tree_header *p_Var1;
  
  HeaderInfo::HeaderInfo(&this->header);
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->objects_bytype)._M_t._M_impl.super__Rb_tree_header;
  (this->objects_bytype)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objects_bytype)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objects_bytype)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objects_bytype)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objects_bytype)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->refs)._M_t._M_impl.super__Rb_tree_header;
  (this->refs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->refs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->refs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->refs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->refs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inv_whitelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inv_whitelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->inv_whitelist)._M_t._M_impl.super__Rb_tree_header;
  (this->inv_whitelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->inv_whitelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->inv_whitelist)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->reader).
              super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>,
             &reader->
              super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>);
  LineSplitter::LineSplitter
            (&this->splitter,
             (reader->
             super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,true,true);
  this->evaluated_count = 0;
  this->schema = (ConversionSchema *)0x0;
  return;
}

Assistant:

DB(std::shared_ptr<StreamReaderLE> reader)
            : reader(reader)
            , splitter(*reader,true,true)
            , evaluated_count()
            , schema( nullptr )
        {}